

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlc.h
# Opt level: O2

int Wlc_ObjIsSignedFanin01(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  Wlc_Obj_t *pWVar1;
  
  if (p->fSmtLib == 0) {
    pWVar1 = Wlc_ObjFanin0(p,pObj);
    if ((undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x40) ==
        (undefined1  [24])0x0) {
      return 0;
    }
    pObj = Wlc_ObjFanin1(p,pObj);
  }
  return *(uint *)pObj >> 6 & 1;
}

Assistant:

static inline int          Wlc_ObjIsSignedFanin01( Wlc_Ntk_t * p, Wlc_Obj_t * pObj ){ return p->fSmtLib ? Wlc_ObjIsSigned(pObj) : (Wlc_ObjFanin0(p, pObj)->Signed && Wlc_ObjFanin1(p, pObj)->Signed); }